

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O2

void __thiscall ConstantExpression::set(ConstantExpression *this,float value)

{
  long lVar1;
  string local_1b8 [32];
  ostringstream builder;
  undefined8 local_190 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&builder,_S_out);
  *(undefined8 *)((long)local_190 + *(long *)(_builder + -0x18)) = 8;
  std::ostream::operator<<((ostringstream *)&builder,value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find((char)local_1b8,0x2e);
  std::__cxx11::string::~string(local_1b8);
  if (lVar1 == -1) {
    std::operator<<((ostream *)&builder,".0");
  }
  this->m_isLiteral = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_text,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&builder);
  return;
}

Assistant:

void set( float value )
	{
		std::ostringstream builder(std::ios_base::out);

		builder.precision(8);
		builder << value;

		if (builder.str().find('.') == std::string::npos)
			builder << ".0";

		m_isLiteral = false;
		m_text = builder.str();
	}